

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

bool __thiscall
duckdb::BatchInsertGlobalState::ReadyToMerge(BatchInsertGlobalState *this,idx_t count)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->row_group_size;
  uVar2 = uVar1 / 10;
  if ((((uVar1 < count) || (count < uVar2 * 9)) &&
      ((uVar1 * 2 < count || (count <= uVar2 * 0x12 && uVar2 * 0x12 - count != 0)))) &&
     ((uVar1 * 3 < count || (count <= uVar2 * 0x1b && uVar2 * 0x1b - count != 0)))) {
    return uVar2 * 0x24 < count || uVar2 * 0x24 - count == 0;
  }
  return true;
}

Assistant:

bool BatchInsertGlobalState::ReadyToMerge(const idx_t count) const {
	// we try to merge so the count fits nicely into row groups
	if (count >= row_group_size / 10 * 9 && count <= row_group_size) {
		// 90%-100% of row group size
		return true;
	}
	if (count >= row_group_size / 10 * 18 && count <= row_group_size * 2) {
		// 180%-200% of row group size
		return true;
	}
	if (count >= row_group_size / 10 * 27 && count <= row_group_size * 3) {
		// 270%-300% of row group size
		return true;
	}
	if (count >= row_group_size / 10 * 36) {
		// >360% of row group size
		return true;
	}
	return false;
}